

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise_x86::create_pipeline_int8_x86(ConvolutionDepthWise_x86 *this,Option *opt)

{
  uint uVar1;
  _func_int *p_Var2;
  ulong uVar3;
  uint uVar4;
  int _w;
  Mat weight_data_r2;
  Mat local_68;
  
  p_Var2 = this->_vptr_ConvolutionDepthWise_x86[-3];
  _w = *(int *)(&this->field_0xd8 + (long)p_Var2) * *(int *)(&this->field_0xd4 + (long)p_Var2);
  uVar1 = *(uint *)(&this->field_0x108 + (long)p_Var2);
  uVar3 = (long)*(int *)(&this->field_0x104 + (long)p_Var2) / (long)(int)uVar1;
  uVar3 = (long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) / (long)_w;
  if ((uVar1 == *(uint *)(&this->field_0xd0 + (long)p_Var2)) &&
     (uVar4 = (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) /
                   (long)((int)*(uint *)(&this->field_0xd0 + (long)p_Var2) / (int)uVar1)) * uVar1,
     uVar4 == uVar1)) {
    if (((uVar4 & 7) == 0) && (opt->use_packing_layout != false)) {
      p_Var2 = this->_vptr_ConvolutionDepthWise_x86[-3];
      Mat::reshape(&local_68,(Mat *)(&this->field_0x168 + (long)p_Var2),_w,
                   *(int *)(&this->field_0x108 + (long)p_Var2),(Allocator *)0x0);
      convert_packing(&local_68,&this->weight_data_int8,8,opt);
      if (local_68.refcount != (int *)0x0) {
        LOCK();
        *local_68.refcount = *local_68.refcount + -1;
        UNLOCK();
        if (*local_68.refcount == 0) {
          if (local_68.allocator == (Allocator *)0x0) {
            if (local_68.data != (void *)0x0) {
              free(local_68.data);
            }
          }
          else {
            (*(local_68.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
  }
  else {
    create_group_ops(this,opt);
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86::create_pipeline_int8_x86(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            elempack = channels % 8 == 0 ? 8 : 1;
        }
#endif // __SSE2__

        if (elempack == 8)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_int8, 8, opt);
        }

        return 0;
    }

    // group convolution
    create_group_ops(opt);

    return 0;
}